

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::Formata(String *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_40;
  int local_3c;
  int n;
  int r;
  va_list arglist;
  bstring b;
  char *fmt_local;
  String *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if ((this->super_tagbstring).mlen < 1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x360,"Write protection error");
  }
  if (fmt == (char *)0x0) {
    operator+=(this,"<NULL>");
  }
  else {
    arglist[0].reg_save_area = bfromcstr("");
    if ((bstring)arglist[0].reg_save_area == (bstring)0x0) {
      operator+=(this,"<NULL>");
    }
    else {
      sVar2 = strlen(fmt);
      local_40 = (int)sVar2 * 2;
      if (local_40 < 0x10) {
        local_40 = 0x10;
      }
      while (iVar1 = balloc((bstring)arglist[0].reg_save_area,local_40 + 2), iVar1 == 0) {
        arglist[0].overflow_arg_area = local_f8;
        arglist[0]._0_8_ = &stack0x00000008;
        r = 0x30;
        n = 0x10;
        local_3c = vsnprintf(*(char **)((long)arglist[0].reg_save_area + 8),(long)(local_40 + 1),fmt
                             ,&n);
        *(undefined1 *)(*(long *)((long)arglist[0].reg_save_area + 8) + (long)local_40) = 0;
        sVar2 = strlen(*(char **)((long)arglist[0].reg_save_area + 8));
        *(int *)((long)arglist[0].reg_save_area + 4) = (int)sVar2;
        if (*(int *)((long)arglist[0].reg_save_area + 4) < local_40) goto LAB_0011bcb0;
        if (local_40 < local_3c) {
          local_40 = local_3c;
        }
        else {
          local_40 = local_40 * 2;
        }
      }
      arglist[0].reg_save_area = bformat("<OUTM>");
LAB_0011bcb0:
      operator+=(this,(tagbstring *)arglist[0].reg_save_area);
      bdestroy((bstring)arglist[0].reg_save_area);
    }
  }
  return;
}

Assistant:

void String::Formata(const char * fmt, ...)
    {
        bstring b;
        va_list arglist;
        int r, n;

        if (mlen <= 0)     bstringThrow("Write protection error");
        if (fmt == NULL)
        {
            *this += "<NULL>";
        }
        else
        {
            if ((b = bfromcstr("")) == NULL)
            {
                *this += "<NULL>";
            }
            else
            {
                if ((n = 2*(int)strlen(fmt)) < START_VSNBUFF)
                    n = START_VSNBUFF;
                for (;;)
                {
                    if (BSTR_OK != balloc(b, n + 2))
                    {
                        b = bformat("<OUTM>");
                        break;
                    }

                    va_start(arglist, fmt);
                    exvsnprintf(r, (char *) b->data, n + 1, fmt, arglist);
                    va_end(arglist);

                    b->data[n] = '\0';
                    b->slen = (int)strlen((char *) b->data);

                    if (b->slen < n)    break;
                    if (r > n)            n = r;
                    else                 n += n;
                }
                *this += *b;
                bdestroy(b);
            }
        }
    }